

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

void smix2(uint8_t *B,size_t r,uint32_t N,uint64_t Nloop,yescrypt_flags_t flags,salsa20_blk_t *V,
          uint32_t NROM,salsa20_blk_t *VROM,salsa20_blk_t *XY,pwxform_ctx_t *ctx)

{
  uint32_t uVar1;
  ulong in_RCX;
  size_t in_RSI;
  long in_RDI;
  uint in_R8D;
  salsa20_blk_t *V_j_4;
  salsa20_blk_t *V_j_3;
  salsa20_blk_t *V_j_2;
  salsa20_blk_t *V_j_1;
  salsa20_blk_t *VROM_j;
  salsa20_blk_t *V_j;
  size_t k;
  uint32_t j;
  uint64_t i;
  salsa20_blk_t *Y;
  salsa20_blk_t *X;
  size_t s;
  pwxform_ctx_t *in_stack_00000180;
  int in_stack_0000018c;
  size_t in_stack_00000190;
  salsa20_blk_t *in_stack_00000198;
  salsa20_blk_t *in_stack_000001a0;
  salsa20_blk_t *in_stack_000001a8;
  pwxform_ctx_t *in_stack_000001c8;
  size_t in_stack_000001d0;
  salsa20_blk_t *in_stack_000001d8;
  salsa20_blk_t *in_stack_000001e0;
  salsa20_blk_t *in_stack_000001e8;
  size_t in_stack_000003b0;
  salsa20_blk_t *in_stack_000003b8;
  salsa20_blk_t *in_stack_000003c0;
  salsa20_blk_t *in_stack_000003c8;
  ulong local_60;
  ulong local_50;
  
  if (in_RCX != 0) {
    for (local_60 = 0; local_60 < in_RSI << 1; local_60 = local_60 + 1) {
      for (local_50 = 0; local_50 < 0x10; local_50 = local_50 + 1) {
        uVar1 = le32dec((void *)(in_RDI + (local_60 * 0x10 + (local_50 * 5 & 0xf)) * 4));
        V_j_2->w[local_60 * 0x10 + local_50] = uVar1;
      }
    }
    local_50 = in_RCX >> 1;
    integerify(V_j_2,in_RSI);
    if ((V_j_3 == (salsa20_blk_t *)0x0) || ((in_R8D & 1) == 0)) {
      if (V_j_3 == (salsa20_blk_t *)0x0) {
        if ((in_R8D & 1) == 0) {
          if (V_j_1 == (salsa20_blk_t *)0x0) {
            do {
              blockmix_salsa8_xor(in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                                  in_stack_000003b0);
              blockmix_salsa8_xor(in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                                  in_stack_000003b0);
              local_50 = local_50 - 1;
            } while (local_50 != 0);
          }
          else {
            do {
              blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                           in_stack_0000018c,in_stack_00000180);
              blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                           in_stack_0000018c,in_stack_00000180);
              local_50 = local_50 - 1;
            } while (local_50 != 0);
          }
        }
        else {
          do {
            blockmix_xor_save(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                              in_stack_000001d0,in_stack_000001c8);
            blockmix_xor_save(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                              in_stack_000001d0,in_stack_000001c8);
            local_50 = local_50 - 1;
          } while (local_50 != 0);
        }
      }
      else {
        for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 2) {
          blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                       in_stack_0000018c,in_stack_00000180);
          blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                       in_stack_0000018c,in_stack_00000180);
        }
      }
    }
    else {
      for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 2) {
        blockmix_xor_save(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                          in_stack_000001c8);
        blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                     in_stack_0000018c,in_stack_00000180);
      }
    }
    for (local_60 = 0; local_60 < in_RSI << 1; local_60 = local_60 + 1) {
      for (local_50 = 0; local_50 < 0x10; local_50 = local_50 + 1) {
        le32enc((void *)(in_RDI + (local_60 * 0x10 + (local_50 * 5 & 0xf)) * 4),
                V_j_2->w[local_60 * 0x10 + local_50]);
      }
    }
  }
  return;
}

Assistant:

static void
smix2(uint8_t * B, size_t r, uint32_t N, uint64_t Nloop,
    yescrypt_flags_t flags, salsa20_blk_t * V, uint32_t NROM,
    const salsa20_blk_t * VROM, salsa20_blk_t * XY, pwxform_ctx_t * ctx)
{
	size_t s = 2 * r;
	salsa20_blk_t * X = XY, * Y = &XY[s];
	uint64_t i;
	uint32_t j;
	size_t k;

	if (Nloop == 0)
		return;

	/* X <-- B' */
	/* 3: V_i <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			X[k].w[i] = le32dec(&B[(k * 16 + (i * 5 % 16)) * 4]);
		}
	}

	i = Nloop / 2;

	/* 7: j <-- Integerify(X) mod N */
	j = integerify(X, r) & (N - 1);

/*
 * Normally, VROM implies YESCRYPT_RW, but we check for these separately
 * because our SMix resets YESCRYPT_RW for the smix2() calls operating on the
 * entire V when p > 1.
 */
	if (VROM && (flags & YESCRYPT_RW)) {
		/* 6: for i = 0 to N - 1 do */
		for (i = 0; i < Nloop; i += 2) {
			salsa20_blk_t * V_j = &V[j * s];
			const salsa20_blk_t * VROM_j;

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* j <-- Integerify(X) mod NROM */
			j = blockmix_xor_save(X, V_j, Y, r, ctx) & (NROM - 1);
			VROM_j = &VROM[j * s];

			/* X <-- H(X \xor VROM_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, VROM_j, X, r, 1, ctx) & (N - 1);
			V_j = &V[j * s];
		}
	} else if (VROM) {
		/* 6: for i = 0 to N - 1 do */
		for (i = 0; i < Nloop; i += 2) {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* j <-- Integerify(X) mod NROM */
			j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
			V_j = &VROM[j * s];

			/* X <-- H(X \xor VROM_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, V_j, X, r, 1, ctx) & (N - 1);
			V_j = &V[j * s];
		}
	} else if (flags & YESCRYPT_RW) {
		/* 6: for i = 0 to N - 1 do */
		do {
			salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor_save(X, V_j, Y, r, ctx) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor_save(Y, V_j, X, r, ctx) & (N - 1);
		} while (--i);
	} else if (ctx) {
		/* 6: for i = 0 to N - 1 do */
		do {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, V_j, X, r, 0, ctx) & (N - 1);
		} while (--i);
	} else {
		/* 6: for i = 0 to N - 1 do */
		do {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_salsa8_xor(X, V_j, Y, r) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_salsa8_xor(Y, V_j, X, r) & (N - 1);
		} while (--i);
	}

	/* 10: B' <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			le32enc(&B[(k * 16 + (i * 5 % 16)) * 4], X[k].w[i]);
		}
	}
}